

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAPSFile.cpp
# Opt level: O1

int __thiscall CAPSFile::WriteToBuffer(CAPSFile *this,uchar *buffer,uint size_of_buffer)

{
  uchar *buffer_00;
  uchar uVar1;
  uchar uVar2;
  uchar uVar3;
  undefined8 uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  pointer __src;
  pointer paVar10;
  int base_offset;
  int iVar11;
  
  uVar5 = (*this->_vptr_CAPSFile[5])();
  iVar7 = -1;
  if (uVar5 <= size_of_buffer) {
    uVar5 = (this->caps_header_).length;
    uVar6 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
    memcpy(buffer,&this->caps_header_,(long)(int)uVar6);
    uVar5 = (this->caps_info_).header.length;
    uVar5 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
    memcpy(buffer + (int)uVar6,&this->caps_info_,(long)(int)uVar5);
    iVar11 = uVar5 + uVar6;
    __src = (this->list_imge_).
            super__Vector_base<CAPSFile::ImgeItem,_std::allocator<CAPSFile::ImgeItem>_>._M_impl.
            super__Vector_impl_data._M_start;
    if (__src != (this->list_imge_).
                 super__Vector_base<CAPSFile::ImgeItem,_std::allocator<CAPSFile::ImgeItem>_>._M_impl
                 .super__Vector_impl_data._M_finish) {
      do {
        (__src->header).crc = 0;
        uVar5 = (__src->header).length;
        lVar9 = (long)iVar11;
        buffer_00 = buffer + lVar9;
        memcpy(buffer_00,__src,(long)(int)uVar5);
        if (uVar5 - 4 != 0) {
          uVar8 = 0;
          do {
            uVar1 = buffer[uVar8 + lVar9 + 4];
            uVar2 = buffer[uVar8 + lVar9 + 5];
            uVar3 = buffer[uVar8 + lVar9 + 6];
            buffer[uVar8 + lVar9 + 4] = buffer[uVar8 + lVar9 + 7];
            buffer[uVar8 + lVar9 + 5] = uVar3;
            buffer[uVar8 + lVar9 + 6] = uVar2;
            buffer[uVar8 + lVar9 + 7] = uVar1;
            uVar8 = uVar8 + 4;
          } while (uVar8 < uVar5 - 4);
        }
        uVar6 = CRC::ComputeCrc32(0xedb88320,buffer_00,uVar5);
        *(uint *)(buffer_00 + 8) =
             uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
        iVar11 = iVar11 + uVar5;
        __src = __src + 1;
      } while (__src != (this->list_imge_).
                        super__Vector_base<CAPSFile::ImgeItem,_std::allocator<CAPSFile::ImgeItem>_>.
                        _M_impl.super__Vector_impl_data._M_finish);
    }
    paVar10 = (this->list_data_).
              super__Vector_base<CAPSFile::DataChunks,_std::allocator<CAPSFile::DataChunks>_>.
              _M_impl.super__Vector_impl_data._M_start;
    iVar7 = 0;
    if (paVar10 !=
        (this->list_data_).
        super__Vector_base<CAPSFile::DataChunks,_std::allocator<CAPSFile::DataChunks>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        uVar5 = (paVar10->header).length;
        if (3 < uVar5) {
          (paVar10->header).crc = 0;
          lVar9 = (long)iVar11;
          uVar4 = *(undefined8 *)&paVar10->data_crc;
          *(undefined8 *)(buffer + lVar9 + 0xc) = *(undefined8 *)&paVar10->size;
          *(undefined8 *)(buffer + lVar9 + 0xc + 8) = uVar4;
          uVar4 = *(undefined8 *)&(paVar10->header).crc;
          *(undefined8 *)(buffer + lVar9) = *(undefined8 *)&paVar10->header;
          *(undefined8 *)(buffer + lVar9 + 8) = uVar4;
          uVar8 = 0xfffffffffffffffc;
          do {
            uVar1 = buffer[uVar8 + lVar9 + 8];
            uVar2 = buffer[uVar8 + lVar9 + 9];
            uVar3 = buffer[uVar8 + lVar9 + 10];
            buffer[uVar8 + lVar9 + 8] = buffer[uVar8 + lVar9 + 0xb];
            buffer[uVar8 + lVar9 + 9] = uVar3;
            buffer[uVar8 + lVar9 + 10] = uVar2;
            buffer[uVar8 + lVar9 + 0xb] = uVar1;
            uVar8 = uVar8 + 4;
          } while (uVar8 < 0x14);
          memcpy(buffer + (iVar11 + 0x1c),paVar10->buffer,(ulong)paVar10->size);
          iVar11 = iVar11 + 0x1c + paVar10->size;
          uVar5 = CRC::ComputeCrc32(0xedb88320,buffer + lVar9,uVar5);
          *(uint *)(buffer + lVar9 + 8) =
               uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
        }
        if (paVar10->buffer != (uchar *)0x0) {
          operator_delete__(paVar10->buffer);
        }
        paVar10->buffer = (uchar *)0x0;
        paVar10 = paVar10 + 1;
      } while (paVar10 !=
               (this->list_data_).
               super__Vector_base<CAPSFile::DataChunks,_std::allocator<CAPSFile::DataChunks>_>.
               _M_impl.super__Vector_impl_data._M_finish);
      iVar7 = 0;
    }
  }
  return iVar7;
}

Assistant:

int CAPSFile::WriteToBuffer(unsigned char* buffer, unsigned int size_of_buffer)
{
   // Write header
   int offset = 0;

   if (size_of_buffer < ComputeSize())
      return -1;

   int size = SwapInt(caps_header_.length);
   memcpy(&buffer[offset], &caps_header_, size);
   offset += size;

   // Write INFO
   size = SwapInt(caps_info_.header.length);
   memcpy(&buffer[offset], &caps_info_, size);
   offset += size;

   // Write IMGE
   for (std::vector<ImgeItem>::iterator it = list_imge_.begin(); it != list_imge_.end(); ++it)
   {
      int base_offset = offset;
      it->header.crc = 0;
      int lg = it->header.length;
      memcpy(&buffer[offset], &(*it), lg);
      Swap(&buffer[offset + 4], lg - 4);
      unsigned int crc = SwapInt(CRC::ComputeCrc32(0xEDB88320, &buffer[base_offset], lg));
      memcpy(&buffer[offset + 8], &crc, 4);
      offset += lg;
   }

   // Write DATA
   for (std::vector<DataChunks>::iterator it = list_data_.begin(); it != list_data_.end(); ++it)
   {
      if (it->header.length >= 4)
      {
         // datablock
         int base_offset = offset;
         it->header.crc = 0;
         int lg = it->header.length;

         memcpy(&buffer[offset], &(*it), sizeof(DataChunks) - sizeof(unsigned char*));
         Swap(&buffer[offset + 4], sizeof(DataChunks) - (4+ sizeof(unsigned char*)));
         offset += sizeof(DataChunks) - sizeof(unsigned char*);

         memcpy(&buffer[offset], it->buffer, it->size);
         offset += it->size;

         unsigned int crc = SwapInt(CRC::ComputeCrc32(0xEDB88320, &buffer[base_offset], lg));
         memcpy(&buffer[base_offset + 8], &crc, 4);
      }
      delete[]it->buffer;
      it->buffer = NULL;
   }

   return 0;
}